

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall
HModel::util_addCols
          (HModel *this,int ncols,double *XcolCost,double *XcolLower,double *XcolUpper,int nnonz,
          int *XAstart,int *XAindex,double *XAvalue)

{
  int iVar1;
  uint uVar2;
  pointer piVar3;
  pointer pdVar4;
  long lVar5;
  pointer piVar6;
  undefined4 in_register_00000034;
  size_type sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  uVar8 = (ulong)(uint)ncols;
  printf("Called model.util_addCols(ncols=%d, nnonz = %d)\n",CONCAT44(in_register_00000034,ncols),
         (ulong)(uint)nnonz);
  std::ostream::flush();
  printf("Called model.util_addCols(ncols=%d, nnonz = %d)\n",uVar8,(ulong)(uint)nnonz);
  std::ostream::flush();
  if (ncols == 0) {
    return;
  }
  lVar5 = (long)ncols;
  sVar7 = this->numCol + lVar5;
  std::vector<double,_std::allocator<double>_>::resize(&this->colCost,sVar7);
  std::vector<double,_std::allocator<double>_>::resize(&this->colLower,sVar7);
  std::vector<double,_std::allocator<double>_>::resize(&this->colUpper,sVar7);
  std::vector<double,_std::allocator<double>_>::resize(&this->colScale,sVar7);
  std::vector<int,_std::allocator<int>_>::resize(&this->Astart,(long)((int)sVar7 + 1));
  piVar6 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < ncols) {
    uVar9 = 0;
    do {
      iVar1 = this->numCol;
      lVar10 = uVar9 + (long)iVar1;
      (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar10] = XcolCost[uVar9];
      (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar10] = XcolLower[uVar9];
      (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar10] = XcolUpper[uVar9];
      (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar10] = 1.0;
      printf("In HModel::util_addCols: column %d: setting Astart[numCol+col+1] = %d \n",
             uVar9 & 0xffffffff,(ulong)(uint)piVar6[iVar1]);
      std::ostream::flush();
      piVar6 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6[(long)this->numCol + uVar9 + 1] = piVar6[this->numCol];
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  printf("In HModel::util_addCols: nnonz = %d; cuNnonz = %d\n",(ulong)(uint)nnonz,
         (ulong)(uint)piVar6[this->numCol]);
  std::ostream::flush();
  piVar6 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < nnonz) {
    uVar2 = piVar6[this->numCol];
    lVar10 = (long)(int)uVar2;
    sVar7 = nnonz + lVar10;
    std::vector<int,_std::allocator<int>_>::resize(&this->Aindex,sVar7);
    std::vector<double,_std::allocator<double>_>::resize(&this->Avalue,sVar7);
    if (0 < ncols) {
      uVar9 = 0;
      do {
        printf("In HModel::util_addCols: column %d: setting Astart[numCol+col] = %d = %d + %d\n",
               uVar9 & 0xffffffff,(ulong)(XAstart[uVar9] + uVar2),(ulong)(uint)XAstart[uVar9],
               (ulong)uVar2);
        std::ostream::flush();
        (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start[(long)this->numCol + uVar9] = XAstart[uVar9] + uVar2;
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    uVar8 = 0;
    printf("In HModel::util_addCols: setting Astart[numCol+ncols] = %d\n",sVar7 & 0xffffffff);
    std::ostream::flush();
    piVar6 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6[this->numCol + lVar5] = (int)sVar7;
    piVar3 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      piVar3[lVar10 + uVar8] = XAindex[uVar8];
      pdVar4[lVar10 + uVar8] = XAvalue[uVar8];
      uVar8 = uVar8 + 1;
    } while ((uint)nnonz != uVar8);
  }
  lVar5 = this->numCol + lVar5;
  this->numCol = (int)lVar5;
  this->numTot = this->numTot + ncols;
  printf("In HModel::util_addCols: Model now has Astart[%d] = %d nonzeros\n",lVar5,
         (ulong)(uint)piVar6[lVar5]);
  std::ostream::flush();
  extendWithLogicalBasis(this,this->numCol - ncols,this->numCol + -1,this->numRow,-1);
  return;
}

Assistant:

void HModel::util_addCols(int ncols, const double* XcolCost, const double* XcolLower, const double* XcolUpper,
			  int nnonz, const int* XAstart, const int* XAindex, const double* XAvalue) {
  assert(ncols >= 0);
  assert(nnonz >= 0);
  //ToDo How to check that Astart[numCol] exists in util_addCols?
#ifdef JAJH_dev
  printf("Called model.util_addCols(ncols=%d, nnonz = %d)\n", ncols, nnonz);cout << flush;
#endif
  printf("Called model.util_addCols(ncols=%d, nnonz = %d)\n", ncols, nnonz);cout << flush;

  if (ncols==0) return;

  int nwNumCol = numCol + ncols;
  colCost.resize(nwNumCol);
  colLower.resize(nwNumCol);
  colUpper.resize(nwNumCol);
  colScale.resize(nwNumCol);
  Astart.resize(nwNumCol+1);

  //Note that the new columns must have starts, even if they have no entries (yet)
  for (int col = 0; col < ncols; col++) {
    colCost[numCol+col] = XcolCost[col];
    colLower[numCol+col] = XcolLower[col];
    colUpper[numCol+col] = XcolUpper[col];
    colScale[numCol+col] = 1.0;
    printf("In HModel::util_addCols: column %d: setting Astart[numCol+col+1] = %d \n", col, Astart[numCol]); cout<<flush;
    Astart[numCol+col+1] = Astart[numCol];
  }

  printf("In HModel::util_addCols: nnonz = %d; cuNnonz = %d\n", nnonz, Astart[numCol]); cout<<flush;
  if (nnonz > 0) {
    //Determine the current number of nonzeros
    int cuNnonz = Astart[numCol];

    //Determine the new number of nonzeros and resize the column-wise matrix arrays
    int nwNnonz = cuNnonz + nnonz;
    //Astart.resize(nwNumCol+1);
    Aindex.resize(nwNnonz);
    Avalue.resize(nwNnonz);

    //Add the new columns
    for (int col = 0; col < ncols; col++) {
      printf("In HModel::util_addCols: column %d: setting Astart[numCol+col] = %d = %d + %d\n",
	     col, XAstart[col]+cuNnonz, XAstart[col], cuNnonz); cout<<flush;
      Astart[numCol+col] = XAstart[col]+cuNnonz;
    }
    printf("In HModel::util_addCols: setting Astart[numCol+ncols] = %d\n", nwNnonz); cout<<flush;
    Astart[numCol+ncols] = nwNnonz;


    for (int el = 0; el < nnonz; el++) {
      int row = XAindex[el];
#ifdef H2DEBUG
      assert(row >=0);
      assert(row < numRow);
#endif
      Aindex[cuNnonz+el] = row;
      Avalue[cuNnonz+el] = XAvalue[el];
    }
  }
  //Increase the number of columns and total number of variables in the model
  numCol += ncols;
  numTot += ncols;

  printf("In HModel::util_addCols: Model now has Astart[%d] = %d nonzeros\n", numCol, Astart[numCol]); cout<<flush;


  //Update the basis and work vectors correponding to new nonbasic columns
  extendWithLogicalBasis(numCol-ncols, numCol-1, numRow, -1);

}